

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

size_t http_write_cb(char *ptr,size_t size,size_t nmemb,void *user_data)

{
  ulong __n;
  ulong uVar1;
  
  if (user_data == (void *)0x0) {
LAB_0010884e:
    __n = 0;
  }
  else {
    if (*user_data == (FILE *)0x0) {
      uVar1 = *(long *)((long)user_data + 0x10) - *(long *)((long)user_data + 0x18);
      if (uVar1 == 0) goto LAB_0010884e;
      __n = nmemb * size;
      if (uVar1 <= nmemb * size) {
        __n = uVar1;
      }
      memcpy((void *)(*(long *)((long)user_data + 0x18) + *(long *)((long)user_data + 8)),ptr,__n);
    }
    else {
      __n = fwrite(ptr,size,nmemb,*user_data);
    }
    *(long *)((long)user_data + 0x18) = *(long *)((long)user_data + 0x18) + __n;
  }
  return __n;
}

Assistant:

size_t http_write_cb(char *ptr, size_t size, size_t nmemb, void *user_data) {
    struct http_body *param = (struct http_body *)user_data;
    if (!param) {
        return 0;
    }
    if(param->f != NULL){
        size_t nc = fwrite(ptr, size, nmemb, param->f);
        param->pos_n += nc;
        return nc;
    }
    size_t remain_size = param->buffer_size - param->pos_n;
    if(remain_size <= 0){ 
        return 0;//buffer 已经写满。
    }
    size_t curl_writen_size = size*nmemb;
    if(curl_writen_size < remain_size){ //要写的数据还在 buffer 的范围内。
        memcpy(param->buffer+param->pos_n, ptr, curl_writen_size);
        param->pos_n += curl_writen_size;
        return curl_writen_size;
    }else{//要写的数据超出了 buffer 的范围，把 buffer 写满即可。
        memcpy(param->buffer+param->pos_n, ptr, remain_size);
        param->pos_n += remain_size;
        return remain_size;
    }
}